

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_12::ScanLineProcess::update_pointers
          (ScanLineProcess *this,DeepFrameBuffer *outfb,int fbY,int fbLastY)

{
  undefined8 *puVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  DeepSlice *pDVar7;
  long lVar8;
  
  iVar2 = (this->cinfo).start_y;
  (this->decoder).user_line_begin_skip = fbY - iVar2;
  (this->decoder).user_line_end_ignore = 0;
  lVar6 = (long)iVar2 + (long)(this->cinfo).height + -1;
  if (fbLastY < lVar6) {
    (this->decoder).user_line_end_ignore = (int)lVar6 - fbLastY;
  }
  if ((this->counts_only == false) && (0 < (this->decoder).channel_count)) {
    lVar6 = 0x28;
    lVar8 = 0;
    do {
      peVar3 = (this->decoder).channels;
      pDVar7 = DeepFrameBuffer::findSlice(outfb,*(char **)((long)peVar3 + lVar6 + -0x28));
      if ((pDVar7 == (DeepSlice *)0x0) || (*(int *)((long)peVar3 + lVar6 + -0x20) == 0)) {
        puVar1 = (undefined8 *)((long)peVar3 + lVar6 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      else {
        *(undefined2 *)((long)peVar3 + lVar6 + -0xc) =
             *(undefined2 *)&(pDVar7->super_Slice).field_0x34;
        *(short *)((long)peVar3 + lVar6 + -10) = (short)(pDVar7->super_Slice).type;
        sVar4 = (pDVar7->super_Slice).xStride;
        *(int *)((long)peVar3 + lVar6 + -8) = (int)sVar4;
        sVar5 = (pDVar7->super_Slice).yStride;
        *(int *)((long)peVar3 + lVar6 + -4) = (int)sVar5;
        *(char **)((long)&peVar3->channel_name + lVar6) =
             (pDVar7->super_Slice).base + sVar5 * (long)fbY + (long)(this->cinfo).start_x * sVar4;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x30;
    } while (lVar8 < (this->decoder).channel_count);
  }
  return;
}

Assistant:

void ScanLineProcess::update_pointers (
    const DeepFrameBuffer *outfb, int fbY, int fbLastY)
{
    decoder.user_line_begin_skip = fbY - cinfo.start_y;
    decoder.user_line_end_ignore = 0;
    int64_t endY = (int64_t)cinfo.start_y + (int64_t)cinfo.height - 1;
    if ((int64_t)fbLastY < endY)
        decoder.user_line_end_ignore = (int32_t)(endY - fbLastY);

    if (counts_only)
        return;

    for (int c = 0; c < decoder.channel_count; ++c)
    {
        exr_coding_channel_info_t& curchan = decoder.channels[c];
        uint8_t*                   ptr;
        const DeepSlice*           fbslice;

        fbslice = outfb->findSlice (curchan.channel_name);

        if (curchan.height == 0 || !fbslice)
        {
            curchan.decode_to_ptr     = NULL;
            curchan.user_pixel_stride = 0;
            curchan.user_line_stride  = 0;
            continue;
        }

        curchan.user_bytes_per_element = fbslice->sampleStride;
        curchan.user_data_type         = (exr_pixel_type_t)fbslice->type;
        curchan.user_pixel_stride      = fbslice->xStride;
        curchan.user_line_stride       = fbslice->yStride;

        ptr  = reinterpret_cast<uint8_t*> (fbslice->base);
        ptr += int64_t (cinfo.start_x) * int64_t (fbslice->xStride);
        ptr += int64_t (fbY) * int64_t (fbslice->yStride);

        curchan.decode_to_ptr = ptr;
    }
}